

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall wabt::AST::PreDecl<(wabt::ExprType)24>(AST *this,VarExpr<(wabt::ExprType)24> *ve)

{
  bool bVar1;
  __type _Var2;
  string *__lhs;
  string *__rhs;
  Var *local_50;
  void *local_48;
  ExprType local_40;
  NodeType local_3c;
  reference local_38;
  Node *n;
  iterator __end2;
  iterator __begin2;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *__range2;
  VarExpr<(wabt::ExprType)24> *ve_local;
  AST *this_local;
  
  __end2 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::begin(&this->predecls);
  n = (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->predecls);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                                *)&n);
    if (!bVar1) {
      local_3c = Decl;
      local_40 = Nop;
      local_48 = (void *)0x0;
      local_50 = &ve->var;
      std::vector<wabt::Node,std::allocator<wabt::Node>>::
      emplace_back<wabt::NodeType,wabt::ExprType,decltype(nullptr),wabt::Var_const*>
                ((vector<wabt::Node,std::allocator<wabt::Node>> *)&this->predecls,&local_3c,
                 &local_40,&local_48,&local_50);
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
               ::operator*(&__end2);
    __lhs = Var::name_abi_cxx11_((local_38->u).var);
    __rhs = Var::name_abi_cxx11_(&ve->var);
    _Var2 = std::operator==(__lhs,__rhs);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void PreDecl(const VarExpr<T>& ve) {
    // FIXME: this is slow, and would be better to avoid in callers.
    // See https://github.com/WebAssembly/wabt/issues/1565
    // And https://github.com/WebAssembly/wabt/issues/1665
    for (auto& n : predecls) {
      if (n.u.var->name() == ve.var.name()) {
        return;
      }
    }
    predecls.emplace_back(NodeType::Decl, ExprType::Nop, nullptr, &ve.var);
  }